

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O3

void transmaskwallscan(int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,
                      double yrepeat,_func_BYTE_ptr_FTexture_ptr_int *getcol)

{
  long lVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  double dVar5;
  fixed_t fVar6;
  short *psVar7;
  short *psVar8;
  float *pfVar9;
  fixed_t *pfVar10;
  ulong uVar11;
  bool bVar12;
  DWORD DVar13;
  int iVar14;
  byte bVar15;
  _func_BYTE_ptr_FTexture_ptr_int *p_Var16;
  int iVar17;
  BYTE *pBVar18;
  long lVar19;
  int iVar20;
  int unaff_R14D;
  byte bVar21;
  long lVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  double dVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  uint uVar30;
  uint uVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar35;
  uint uVar36;
  _func_fixed_t *tmvline1;
  _func_void *tmvline4;
  BYTE *local_f8;
  _func_fixed_t *local_d0;
  undefined1 local_c8 [16];
  short *local_b0;
  short *local_a8;
  float *local_a0;
  fixed_t *local_98;
  double local_90;
  int local_88 [4];
  int local_78 [6];
  BYTE *local_60;
  ulong local_58;
  fixed_t *local_50;
  BYTE *local_48;
  float *local_40;
  _func_void *local_38;
  
  if (rw_pic->UseType != '\r') {
    local_c8 = ZEXT416((uint)(rw_light - rw_lightstep));
    local_b0 = uwal;
    local_a8 = dwal;
    local_a0 = swal;
    local_98 = lwal;
    local_90 = yrepeat;
    bVar12 = R_GetTransMaskDrawers(&local_d0,&local_38);
    if (bVar12) {
      iVar17 = 0x20 - (uint)rw_pic->HeightBits;
      setuptmvline(iVar17);
      psVar8 = local_a8;
      psVar7 = local_b0;
      fVar6 = rw_offset;
      local_60 = basecolormap->Maps;
      lVar19 = (long)x1;
      bVar12 = fixedcolormap != (lighttable_t *)0x0;
      bVar23 = -1 < fixedlightlev;
      local_f8 = dc_destorg + lVar19;
      if (bVar23 || bVar12) {
        palookupoffse[2]._0_4_ = dc_colormap._0_4_;
        palookupoffse[2]._4_4_ = dc_colormap._4_4_;
        palookupoffse[3]._0_4_ = dc_colormap._0_4_;
        palookupoffse[3]._4_4_ = dc_colormap._4_4_;
        palookupoffse[0]._0_4_ = dc_colormap._0_4_;
        palookupoffse[0]._4_4_ = dc_colormap._4_4_;
        palookupoffse[1]._0_4_ = dc_colormap._0_4_;
        palookupoffse[1]._4_4_ = dc_colormap._4_4_;
      }
      bVar15 = (byte)iVar17;
      p_Var16 = getcol;
      if (((ulong)local_f8 & 3) != 0 && x1 < x2) {
        dVar5 = 6755399441055744.0 / (double)(1 << (bVar15 & 0x1f));
        local_50 = local_98 + lVar19;
        local_40 = local_a0 + lVar19;
        pBVar18 = dc_destorg + lVar19 + 1;
        lVar22 = 0;
        fVar24 = rw_lightstep;
        local_48 = pBVar18;
        do {
          local_c8._0_4_ = (float)local_c8._0_4_ + fVar24;
          sVar2 = psVar7[lVar19 + lVar22];
          p_Var16 = (_func_BYTE_ptr_FTexture_ptr_int *)(long)sVar2;
          unaff_R14D = (int)psVar8[lVar19 + lVar22];
          if (sVar2 < psVar8[lVar19 + lVar22]) {
            if (!bVar23 && !bVar12) {
              dVar26 = (double)(float)local_c8._0_4_;
              if (24.0 <= dVar26) {
                dVar26 = 24.0;
              }
              iVar17 = wallshade - SUB84(dVar26 + 103079215104.0,0) >> 0x10;
              if (0x1e < iVar17) {
                iVar17 = 0x1f;
              }
              if (iVar17 < 1) {
                iVar17 = 0;
              }
              dc_colormap = local_60 + (uint)(iVar17 << 8);
            }
            dc_source = (*getcol)(rw_pic,local_50[lVar22] + fVar6 >> 0x10);
            dc_dest = local_f8 + ylookup[(long)p_Var16] + lVar22;
            dc_count = unaff_R14D - sVar2;
            dc_iscale = SUB84((double)local_40[lVar22] * local_90 + dVar5,0);
            dc_texturefrac =
                 SUB84(dc_texturemid + dVar5 +
                       (((double)(int)sVar2 + 0.5) - CenterY) * (double)local_40[lVar22] * local_90,
                       0);
            (*local_d0)();
            pBVar18 = local_48;
            fVar24 = rw_lightstep;
          }
          lVar1 = lVar22 + 1;
        } while ((lVar22 + lVar19 + 1 < (long)x2) &&
                (iVar17 = (int)lVar22, lVar22 = lVar1, (iVar17 + (int)pBVar18 & 3U) != 0));
        x1 = x1 + (int)lVar1;
        local_f8 = local_f8 + lVar1;
      }
      local_78[0] = (int)p_Var16;
      local_88[0] = unaff_R14D;
      local_50 = (fixed_t *)CONCAT44(local_50._4_4_,x2 + -3);
      if (x1 < x2 + -3) {
        dVar5 = 6755399441055744.0 / (double)(1 << (bVar15 & 0x1f));
        iVar17 = x1 + 3;
        local_58 = (ulong)(uint)x2;
        do {
          pfVar10 = local_98;
          pfVar9 = local_a0;
          psVar8 = local_a8;
          psVar7 = local_b0;
          lVar19 = 4;
          bVar21 = 0;
          do {
            sVar2 = psVar7[(long)iVar17 + lVar19 + -4];
            local_88[lVar19 + 3] = (int)sVar2;
            sVar3 = psVar8[(long)iVar17 + lVar19 + -4];
            local_88[lVar19 + -1] = (int)sVar3;
            if (sVar2 < sVar3) {
              pBVar18 = (*getcol)(rw_pic,pfVar10[(long)iVar17 + lVar19 + -4] + fVar6 >> 0x10);
              palookupoffse[lVar19 + 3] = pBVar18;
              dVar26 = (double)pfVar9[(long)iVar17 + lVar19 + -4] * local_90 + dVar5;
              vplce[lVar19 + 3] = SUB84(dVar26,0);
              *(int *)(lVar19 * 4 + 0x8b408c) =
                   SUB84(dc_texturemid + dVar5 +
                         (((double)(int)sVar2 + 0.5) - CenterY) *
                         (double)((ulong)dVar26 & 0xffffffff),0);
            }
            else {
              bVar21 = bVar21 + (char)(1 << ((char)lVar19 - 1U & 0x1f));
            }
            uVar11 = local_58;
            fVar24 = rw_lightstep;
            iVar4 = wallshade;
            lVar19 = lVar19 + -1;
          } while (lVar19 != 0);
          if (bVar21 == 0xf) {
            local_c8._0_4_ = (float)local_c8._0_4_ + rw_lightstep * 4.0;
LAB_00312dd5:
            x2 = (int)uVar11;
          }
          else {
            auVar32 = local_c8;
            if (!bVar23 && !bVar12) {
              fVar25 = rw_lightstep * 4.0;
              fVar28 = rw_lightstep * 0.0 + (float)local_c8._0_4_;
              fVar29 = rw_lightstep * 1.0 + (float)local_c8._0_4_;
              fVar27 = rw_lightstep + rw_lightstep;
              lVar19 = 0;
              do {
                auVar31._0_8_ = (double)(fVar24 + fVar28);
                auVar31._8_8_ = (double)(fVar24 + fVar29);
                auVar32._8_8_ = 0x4038000000000000;
                auVar32._0_8_ = 0x4038000000000000;
                auVar32 = minpd(auVar31,auVar32);
                uVar35 = iVar4 - SUB84(auVar32._0_8_ + 103079215104.0,0) >> 0x10;
                uVar36 = iVar4 - SUB84(auVar32._8_8_ + 103079215104.0,0) >> 0x10;
                uVar30 = -(uint)((int)uVar35 < 0x1f);
                uVar34 = -(uint)((int)uVar36 < 0x1f);
                uVar30 = ~uVar30 & 0x1f | uVar35 & uVar30;
                uVar34 = ~uVar34 & 0x1f | uVar36 & uVar34;
                auVar33._8_4_ = (int)local_60;
                auVar33._0_8_ = local_60;
                auVar33._12_4_ = (int)((ulong)local_60 >> 0x20);
                palookupoffse[lVar19] = local_60 + ((-(uint)(0 < (int)uVar30) & uVar30) << 8);
                palookupoffse[lVar19 + 1] =
                     (BYTE *)(auVar33._8_8_ + (ulong)((-(uint)(0 < (int)uVar34) & uVar34) << 8));
                lVar19 = lVar19 + 2;
                fVar28 = fVar28 + fVar27;
                fVar29 = fVar29 + fVar27;
                auVar32 = ZEXT416((uint)(fVar25 + (float)local_c8._0_4_));
              } while (lVar19 != 4);
            }
            local_c8 = auVar32;
            iVar4 = local_78[1];
            if (local_78[1] < local_78[0]) {
              iVar4 = local_78[0];
            }
            iVar14 = local_78[3];
            if (local_78[3] < local_78[2]) {
              iVar14 = local_78[2];
            }
            if (iVar14 < iVar4) {
              iVar14 = iVar4;
            }
            iVar4 = local_88[1];
            if (local_88[0] < local_88[1]) {
              iVar4 = local_88[0];
            }
            iVar20 = local_88[3];
            if (local_88[2] < local_88[3]) {
              iVar20 = local_88[2];
            }
            if (iVar4 < iVar20) {
              iVar20 = iVar4;
            }
            if ((bVar21 != 0) || (iVar20 - iVar14 == 0 || iVar20 < iVar14)) {
              lVar19 = 0;
              do {
                if ((bVar21 & 1) == 0) {
                  dc_count = local_88[lVar19] - local_88[lVar19 + 4];
                  dc_dest = local_f8 + lVar19 + ylookup[local_88[lVar19 + 4]];
                  dc_iscale = vince[lVar19];
                  dc_colormap = palookupoffse[lVar19];
                  dc_texturefrac = vplce[lVar19];
                  dc_source = bufplce[lVar19];
                  (*local_d0)();
                }
                bVar21 = (char)bVar21 >> 1;
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              goto LAB_00312dd5;
            }
            lVar19 = 0;
            do {
              iVar4 = local_88[lVar19 + 4];
              if (iVar4 < iVar14) {
                dc_count = iVar14 - iVar4;
                dc_dest = local_f8 + lVar19 + ylookup[iVar4];
                dc_iscale = vince[lVar19];
                dc_colormap = palookupoffse[lVar19];
                dc_texturefrac = vplce[lVar19];
                dc_source = bufplce[lVar19];
                DVar13 = (*local_d0)();
                vplce[lVar19] = DVar13;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 != 4);
            dc_dest = local_f8 + ylookup[iVar14];
            dc_count = iVar20 - iVar14;
            (*local_38)();
            iVar4 = ylookup[iVar20];
            lVar19 = 0;
            do {
              iVar14 = local_88[lVar19] - iVar20;
              if (iVar14 != 0 && iVar20 <= local_88[lVar19]) {
                dc_iscale = vince[lVar19];
                dc_colormap = (lighttable_t *)
                              CONCAT44(palookupoffse[0]._4_4_,palookupoffse[0]._0_4_);
                dc_texturefrac = vplce[lVar19];
                dc_source = bufplce[lVar19];
                dc_dest = local_f8 + lVar19 + iVar4;
                dc_count = iVar14;
                (*local_d0)();
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 != 4);
            x2 = (int)local_58;
          }
          x1 = x1 + 4;
          local_f8 = local_f8 + 4;
          iVar17 = iVar17 + 4;
        } while (x1 < (int)local_50);
      }
      pfVar10 = local_98;
      pfVar9 = local_a0;
      psVar8 = local_a8;
      psVar7 = local_b0;
      if (x1 < x2) {
        dVar5 = 6755399441055744.0 / (double)(1 << (bVar15 & 0x1f));
        lVar19 = 0;
        fVar24 = rw_lightstep;
        do {
          local_c8._0_4_ = (float)local_c8._0_4_ + fVar24;
          sVar2 = psVar7[x1 + lVar19];
          sVar3 = psVar8[x1 + lVar19];
          if (sVar2 < sVar3) {
            if (!bVar23 && !bVar12) {
              dVar26 = (double)(float)local_c8._0_4_;
              if (24.0 <= dVar26) {
                dVar26 = 24.0;
              }
              iVar17 = wallshade - SUB84(dVar26 + 103079215104.0,0) >> 0x10;
              if (0x1e < iVar17) {
                iVar17 = 0x1f;
              }
              if (iVar17 < 1) {
                iVar17 = 0;
              }
              dc_colormap = local_60 + (uint)(iVar17 << 8);
            }
            dc_source = (*getcol)(rw_pic,pfVar10[x1 + lVar19] + fVar6 >> 0x10);
            dc_dest = local_f8 + ylookup[sVar2] + lVar19;
            dc_count = (int)sVar3 - (int)sVar2;
            dc_iscale = SUB84((double)pfVar9[x1 + lVar19] * local_90 + dVar5,0);
            dc_texturefrac =
                 SUB84(dc_texturemid + dVar5 +
                       (((double)(int)sVar2 + 0.5) - CenterY) *
                       (double)pfVar9[x1 + lVar19] * local_90,0);
            (*local_d0)();
            fVar24 = rw_lightstep;
          }
          lVar19 = lVar19 + 1;
        } while (x2 - x1 != (int)lVar19);
      }
      NetUpdate();
    }
    else {
      maskwallscan(x1,x2,local_b0,local_a8,local_a0,local_98,local_90,getcol);
    }
  }
  return;
}

Assistant:

void transmaskwallscan (int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal,
	double yrepeat, const BYTE *(*getcol)(FTexture *tex, int x))
{
	fixed_t (*tmvline1)();
	void (*tmvline4)();
	int x, fracbits;
	BYTE *p;
	int y1ve[4], y2ve[4], u4, d4, startx, dax, z;
	char bad;
	float light = rw_light - rw_lightstep;
	SDWORD xoffset;
	BYTE *basecolormapdata;
	double iscale;

	if (rw_pic->UseType == FTexture::TEX_Null)
	{
		return;
	}

	if (!R_GetTransMaskDrawers (&tmvline1, &tmvline4))
	{
		// The current translucency is unsupported, so draw with regular maskwallscan instead.
		maskwallscan (x1, x2, uwal, dwal, swal, lwal, yrepeat, getcol);
		return;
	}

//extern cycle_t WallScanCycles;
//clock (WallScanCycles);

	rw_pic->GetHeight();	// Make sure texture size is loaded
	fracbits = 32 - rw_pic->HeightBits;
	setuptmvline(fracbits);
	xoffset = rw_offset;
	basecolormapdata = basecolormap->Maps;
	fixed_t centeryfrac = FLOAT2FIXED(CenterY);

	x = startx = x1;
	p = x + dc_destorg;

	bool fixed = (fixedcolormap != NULL || fixedlightlev >= 0);
	if (fixed)
	{
		palookupoffse[0] = dc_colormap;
		palookupoffse[1] = dc_colormap;
		palookupoffse[2] = dc_colormap;
		palookupoffse[3] = dc_colormap;
	}

	for(; (x < x2) && ((size_t)p & 3); ++x, ++p)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];//max(uwal[x],umost[x]);
		y2ve[0] = dwal[x];//min(dwal[x],dmost[x]);
		if (y2ve[0] <= y1ve[0]) continue;

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + p;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		tmvline1();
	}

	for(; x < x2-3; x += 4, p+= 4)
	{
		bad = 0;
		for (z = 3, dax = x+3; z >= 0; --z, --dax)
		{
			y1ve[z] = uwal[dax];
			y2ve[z] = dwal[dax];
			if (y2ve[z] <= y1ve[z]) { bad += 1<<z; continue; }

			bufplce[z] = getcol (rw_pic, (lwal[dax] + xoffset) >> FRACBITS);
			iscale = swal[dax] * yrepeat;
			vince[z] = xs_ToFixed(fracbits, iscale);
			vplce[z] = xs_ToFixed(fracbits, dc_texturemid + vince[z] * (y1ve[z] - CenterY + 0.5));
		}
		if (bad == 15)
		{
			light += rw_lightstep * 4;
			continue;
		}

		if (!fixed)
		{
			for (z = 0; z < 4; ++z)
			{
				light += rw_lightstep;
				palookupoffse[z] = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
			}
		}

		u4 = MAX(MAX(y1ve[0],y1ve[1]),MAX(y1ve[2],y1ve[3]));
		d4 = MIN(MIN(y2ve[0],y2ve[1]),MIN(y2ve[2],y2ve[3]));

		if ((bad != 0) || (u4 >= d4))
		{
			for (z = 0; z < 4; ++z)
			{
				if (!(bad & 1))
				{
					preptmvline1(vince[z],palookupoffse[z],y2ve[z]-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+p+z);
					tmvline1();
				}
				bad >>= 1;
			}
			continue;
		}

		for (z = 0; z < 4; ++z)
		{
			if (u4 > y1ve[z])
			{
				preptmvline1(vince[z],palookupoffse[z],u4-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+p+z);
				vplce[z] = tmvline1();
			}
		}

		if (d4 > u4)
		{
			dc_count = d4-u4;
			dc_dest = ylookup[u4]+p;
			tmvline4();
		}

		BYTE *i = p+ylookup[d4];
		for (z = 0; z < 4; ++z)
		{
			if (y2ve[z] > d4)
			{
				preptmvline1(vince[z],palookupoffse[0],y2ve[z]-d4,vplce[z],bufplce[z],i+z);
				tmvline1();
			}
		}
	}
	for(; x < x2; ++x, ++p)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];
		y2ve[0] = dwal[x];
		if (y2ve[0] <= y1ve[0]) continue;

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + p;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		tmvline1();
	}

//unclock(WallScanCycles);

	NetUpdate ();
}